

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.hpp
# Opt level: O2

void __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData
          (_ItemSimilarityRecommenderData *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->string_id_values);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->integer_id_values).super__Vector_base<long,_std::allocator<long>_>);
  std::__cxx11::string::~string((string *)&this->item_score_output_column);
  std::__cxx11::string::~string((string *)&this->item_list_output_column);
  std::__cxx11::string::~string((string *)&this->item_data_input_column);
  std::__cxx11::string::~string((string *)&this->item_exclusion_input_column);
  std::__cxx11::string::~string((string *)&this->num_recommendations_input_column);
  std::__cxx11::string::~string((string *)&this->item_restriction_input_column);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree(&(this->item_shift_values)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
               *)this);
  return;
}

Assistant:

_ItemSimilarityRecommenderData(){}